

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Formatter01.c
# Opt level: O0

void DisassembleBuffer(ZydisDecoder *decoder,ZyanU8 *data,ZyanUSize length)

{
  ZyanStatus ZVar1;
  char local_7d8 [8];
  char buffer [256];
  ZydisDecodedOperand operands [10];
  ZydisDecodedInstruction instruction;
  ZyanU64 runtime_address;
  ZydisFormatter formatter;
  ZyanUSize length_local;
  ZyanU8 *data_local;
  ZydisDecoder *decoder_local;
  
  formatter.func_print_decorator = (ZydisFormatterDecoratorFunc)length;
  ZydisFormatterInit((ZydisFormatter *)&runtime_address,ZYDIS_FORMATTER_STYLE_INTEL);
  ZydisFormatterSetProperty((ZydisFormatter *)&runtime_address,ZYDIS_FORMATTER_PROP_FORCE_SEGMENT,1)
  ;
  ZydisFormatterSetProperty((ZydisFormatter *)&runtime_address,ZYDIS_FORMATTER_PROP_FORCE_SIZE,1);
  default_print_address_absolute = ZydisFormatterPrintAddressAbsolute;
  ZydisFormatterSetHook
            ((ZydisFormatter *)&runtime_address,ZYDIS_FORMATTER_FUNC_PRINT_ADDRESS_ABS,
             &default_print_address_absolute);
  instruction.raw.imm[1].size = '\0';
  instruction.raw.imm[1].offset = '\0';
  instruction.raw.imm[1]._18_6_ = 0x7fffffff40;
  length_local = (ZyanUSize)data;
  while( true ) {
    ZVar1 = ZydisDecoderDecodeFull
                      (decoder,(void *)length_local,(ZyanUSize)formatter.func_print_decorator,
                       (ZydisDecodedInstruction *)&operands[9].field_10.mem.disp.offset,
                       (ZydisDecodedOperand *)(buffer + 0xf8));
    if ((ZVar1 & 0x80000000) != 0) break;
    printf("%016lX  ",instruction.raw.imm[1]._16_8_);
    ZydisFormatterFormatInstruction
              ((ZydisFormatter *)&runtime_address,
               (ZydisDecodedInstruction *)&operands[9].field_10.mem.disp.offset,
               (ZydisDecodedOperand *)(buffer + 0xf8),instruction.opcode_map._1_1_,local_7d8,0x100,
               instruction.raw.imm[1]._16_8_,(void *)0x0);
    printf(" %s\n",local_7d8);
    length_local = length_local + (long)(int)(uint)(byte)(undefined1)instruction.machine_mode;
    formatter.func_print_decorator =
         formatter.func_print_decorator + -(ulong)(byte)(undefined1)instruction.machine_mode;
    instruction.raw.imm[1]._16_8_ =
         (ulong)(byte)(undefined1)instruction.machine_mode + instruction.raw.imm[1]._16_8_;
  }
  return;
}

Assistant:

static void DisassembleBuffer(ZydisDecoder* decoder, ZyanU8* data, ZyanUSize length)
{
    ZydisFormatter formatter;
    ZydisFormatterInit(&formatter, ZYDIS_FORMATTER_STYLE_INTEL);
    ZydisFormatterSetProperty(&formatter, ZYDIS_FORMATTER_PROP_FORCE_SEGMENT, ZYAN_TRUE);
    ZydisFormatterSetProperty(&formatter, ZYDIS_FORMATTER_PROP_FORCE_SIZE, ZYAN_TRUE);

    // Replace the `ZYDIS_FORMATTER_FUNC_PRINT_ADDRESS_ABS` function that formats the absolute
    // addresses
    default_print_address_absolute = (ZydisFormatterFunc)&ZydisFormatterPrintAddressAbsolute;
    ZydisFormatterSetHook(&formatter, ZYDIS_FORMATTER_FUNC_PRINT_ADDRESS_ABS,
        (const void**)&default_print_address_absolute);

    ZyanU64 runtime_address = 0x007FFFFFFF400000;

    ZydisDecodedInstruction instruction;
    ZydisDecodedOperand operands[ZYDIS_MAX_OPERAND_COUNT];
    char buffer[256];

    while (ZYAN_SUCCESS(ZydisDecoderDecodeFull(decoder, data, length, &instruction, operands)))
    {
        ZYAN_PRINTF("%016" PRIX64 "  ", runtime_address);

        // We have to pass a `runtime_address` different to `ZYDIS_RUNTIME_ADDRESS_NONE` to
        // enable printing of absolute addresses
        ZydisFormatterFormatInstruction(&formatter, &instruction, operands,
            instruction.operand_count_visible, &buffer[0], sizeof(buffer), runtime_address,
            ZYAN_NULL);
        ZYAN_PRINTF(" %s\n", &buffer[0]);

        data += instruction.length;
        length -= instruction.length;
        runtime_address += instruction.length;
    }
}